

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

Node * __thiscall
spoa::Graph::BranchCompletion
          (Graph *this,uint32_t rank,vector<long,_std::allocator<long>_> *scores,
          vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *predecessors)

{
  value_type pNVar1;
  int64_t iVar2;
  Node *pNVar3;
  long lVar4;
  bool bVar5;
  reference ppNVar6;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *pvVar7;
  size_type sVar8;
  reference pvVar9;
  reference ppEVar10;
  Edge **jt_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range2_1;
  value_type it_1;
  value_type pNStack_78;
  uint32_t i;
  Node *max;
  Edge **jt;
  iterator __end2;
  iterator __begin2;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range2;
  Edge **it;
  iterator __end1;
  iterator __begin1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range1;
  value_type start;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *predecessors_local;
  vector<long,_std::allocator<long>_> *scores_local;
  uint32_t rank_local;
  Graph *this_local;
  
  ppNVar6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                      (&this->rank_to_node_,(ulong)rank);
  pNVar1 = *ppNVar6;
  pvVar7 = &pNVar1->outedges;
  __end1 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin(pvVar7);
  it = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end(pvVar7);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                     *)&it), bVar5) {
    ppEVar10 = __gnu_cxx::
               __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
               ::operator*(&__end1);
    pvVar7 = &(*ppEVar10)->head->inedges;
    __end2 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin(pvVar7);
    jt = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                            (pvVar7);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                       *)&jt), bVar5) {
      ppEVar10 = __gnu_cxx::
                 __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                 ::operator*(&__end2);
      if ((*ppEVar10)->tail != pNVar1) {
        pvVar9 = std::vector<long,_std::allocator<long>_>::operator[]
                           (scores,(ulong)(*ppEVar10)->tail->id);
        *pvVar9 = -1;
      }
      __gnu_cxx::
      __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
    ::operator++(&__end1);
  }
  pNStack_78 = (value_type)0x0;
  it_1._4_4_ = rank + 1;
  do {
    sVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                      (&this->rank_to_node_);
    if (sVar8 <= it_1._4_4_) {
      return pNStack_78;
    }
    ppNVar6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                        (&this->rank_to_node_,(ulong)it_1._4_4_);
    pNVar1 = *ppNVar6;
    pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)pNVar1->id);
    *pvVar9 = -1;
    ppNVar6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                        (predecessors,(ulong)pNVar1->id);
    *ppNVar6 = (value_type)0x0;
    __end2_1 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                         (&pNVar1->inedges);
    jt_1 = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                              (&pNVar1->inedges);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                               *)&jt_1), bVar5) {
      ppEVar10 = __gnu_cxx::
                 __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                 ::operator*(&__end2_1);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[]
                         (scores,(ulong)(*ppEVar10)->tail->id);
      if (*pvVar9 != -1) {
        pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)pNVar1->id);
        if (*pvVar9 < (*ppEVar10)->weight) {
LAB_001216b9:
          iVar2 = (*ppEVar10)->weight;
          pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)pNVar1->id);
          *pvVar9 = iVar2;
          pNVar3 = (*ppEVar10)->tail;
          ppNVar6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                    operator[](predecessors,(ulong)pNVar1->id);
          *ppNVar6 = pNVar3;
        }
        else {
          pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)pNVar1->id);
          if (*pvVar9 == (*ppEVar10)->weight) {
            ppNVar6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                      operator[](predecessors,(ulong)pNVar1->id);
            pvVar9 = std::vector<long,_std::allocator<long>_>::operator[]
                               (scores,(ulong)(*ppNVar6)->id);
            lVar4 = *pvVar9;
            pvVar9 = std::vector<long,_std::allocator<long>_>::operator[]
                               (scores,(ulong)(*ppEVar10)->tail->id);
            if (lVar4 <= *pvVar9) goto LAB_001216b9;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
      ::operator++(&__end2_1);
    }
    ppNVar6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                        (predecessors,(ulong)pNVar1->id);
    if (*ppNVar6 != (value_type)0x0) {
      ppNVar6 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                          (predecessors,(ulong)pNVar1->id);
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)(*ppNVar6)->id);
      lVar4 = *pvVar9;
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)pNVar1->id);
      *pvVar9 = lVar4 + *pvVar9;
    }
    if (pNStack_78 == (value_type)0x0) {
LAB_001217db:
      pNStack_78 = pNVar1;
    }
    else {
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)pNStack_78->id);
      lVar4 = *pvVar9;
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[](scores,(ulong)pNVar1->id);
      if (lVar4 < *pvVar9) goto LAB_001217db;
    }
    it_1._4_4_ = it_1._4_4_ + 1;
  } while( true );
}

Assistant:

Graph::Node* Graph::BranchCompletion(
    std::uint32_t rank,
    std::vector<std::int64_t>* scores,
    std::vector<Node*>* predecessors) {
  auto start = rank_to_node_[rank];
  for (const auto& it : start->outedges) {
    for (const auto& jt : it->head->inedges) {
      if (jt->tail != start) {
        (*scores)[jt->tail->id] = -1;
      }
    }
  }

  Node* max = nullptr;
  for (std::uint32_t i = rank + 1; i < rank_to_node_.size(); ++i) {
    auto it = rank_to_node_[i];
    (*scores)[it->id] = -1;
    (*predecessors)[it->id] = nullptr;

    for (const auto& jt : it->inedges) {
      if ((*scores)[jt->tail->id] == -1) {
        continue;
      }
      if (((*scores)[it->id] < jt->weight) ||
          ((*scores)[it->id] == jt->weight && (*scores)[(*predecessors)[it->id]->id] <= (*scores)[jt->tail->id])) {  // NOLINT
        (*scores)[it->id] = jt->weight;
        (*predecessors)[it->id] = jt->tail;
      }
    }
    if ((*predecessors)[it->id]) {
      (*scores)[it->id] += (*scores)[(*predecessors)[it->id]->id];
    }
    if (!max || (*scores)[max->id] < (*scores)[it->id]) {
      max = it;
    }
  }

  return max;
}